

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O1

bool __thiscall
vkt::image::anon_unknown_2::BinaryAtomicEndResultInstance::verifyResult
          (BinaryAtomicEndResultInstance *this,Allocation *outputBufferAllocation)

{
  AtomicOperation AVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  int z;
  ChannelOrder CVar5;
  uint uVar6;
  int iVar7;
  ChannelOrder CVar8;
  int iVar9;
  ChannelOrder CVar10;
  ChannelOrder CVar11;
  int y;
  UVec3 gridSize;
  ConstPixelBufferAccess resultBuffer;
  bool local_9a;
  int local_98;
  ChannelOrder local_94;
  ChannelOrder local_8c;
  int local_74;
  int local_70;
  int local_6c;
  ConstPixelBufferAccess local_68;
  ChannelOrder local_40;
  
  getShaderGridSize((image *)&local_74,(this->super_BinaryAtomicInstanceBase).m_imageType,
                    &(this->super_BinaryAtomicInstanceBase).m_imageSize);
  iVar3 = local_74;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_68,&(this->super_BinaryAtomicInstanceBase).m_format,local_74,local_70,local_6c,
             outputBufferAllocation->m_hostPtr);
  local_9a = local_68.m_size.m_data[2] < 1;
  if (0 < local_68.m_size.m_data[2]) {
    local_94 = R;
    local_98 = 0;
    do {
      bVar2 = 0 < local_68.m_size.m_data[1];
      if (0 < local_68.m_size.m_data[1]) {
        z = 0;
        local_8c = local_94;
        do {
          if (0 < local_68.m_size.m_data[0]) {
            y = 0;
            CVar11 = local_8c;
            do {
              tcu::ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)&local_40,(int)&local_68,y,z);
              AVar1 = (this->super_BinaryAtomicInstanceBase).m_operation;
              uVar4 = (ulong)AVar1;
              if (uVar4 < 6) {
                CVar5 = *(ChannelOrder *)(&DAT_00b37f04 + uVar4 * 4);
                iVar7 = 5;
                CVar8 = CVar11;
                iVar9 = y;
                do {
                  if (AVar1 < ATOMIC_OPERATION_EXCHANGE) {
                    CVar10 = iVar9 * iVar9 + z * z + local_98 * local_98;
                  }
                  else {
                    CVar10 = ~R;
                    if (AVar1 == ATOMIC_OPERATION_EXCHANGE) {
                      CVar10 = CVar8;
                    }
                  }
                  switch(uVar4) {
                  case 0:
                    CVar5 = CVar5 + CVar10;
                    break;
                  case 1:
                    if ((int)CVar10 <= (int)CVar5) {
                      CVar5 = CVar10;
                    }
                    break;
                  case 2:
                    if ((int)CVar5 <= (int)CVar10) {
                      CVar5 = CVar10;
                    }
                    break;
                  case 3:
                    CVar5 = CVar5 & CVar10;
                    break;
                  case 4:
                    CVar5 = CVar5 | CVar10;
                    break;
                  case 5:
                    CVar5 = CVar5 ^ CVar10;
                    break;
                  case 6:
                    CVar5 = CVar10;
                    break;
                  default:
                    CVar5 = ~R;
                  }
                  iVar9 = iVar9 + local_74;
                  CVar8 = CVar8 + local_70 * local_74;
                  iVar7 = iVar7 + -1;
                } while (iVar7 != 0);
joined_r0x00718710:
                if (local_40 != CVar5) {
                  if (bVar2) {
                    return local_9a;
                  }
                  goto LAB_00718741;
                }
              }
              else if (AVar1 == ATOMIC_OPERATION_EXCHANGE) {
                uVar6 = 0;
                CVar8 = CVar11;
                do {
                  CVar5 = CVar8;
                  if (3 < uVar6) break;
                  uVar6 = uVar6 + 1;
                  CVar8 = CVar5 + local_70 * local_74;
                } while (local_40 != CVar5);
                goto joined_r0x00718710;
              }
              y = y + 1;
              CVar11 = CVar11 + local_70;
            } while (y < local_68.m_size.m_data[0]);
          }
          z = z + 1;
          local_8c = local_8c + A;
          bVar2 = z < local_68.m_size.m_data[1];
        } while (z < local_68.m_size.m_data[1]);
      }
LAB_00718741:
      local_98 = local_98 + 1;
      local_94 = local_94 + iVar3 * local_70 * 5;
      local_9a = local_68.m_size.m_data[2] <= local_98;
    } while (local_98 < local_68.m_size.m_data[2]);
  }
  return local_9a;
}

Assistant:

bool BinaryAtomicEndResultInstance::verifyResult (Allocation& outputBufferAllocation) const
{
	const UVec3	gridSize			= getShaderGridSize(m_imageType, m_imageSize);
	const IVec3 extendedGridSize	= IVec3(NUM_INVOCATIONS_PER_PIXEL*gridSize.x(), gridSize.y(), gridSize.z());

	tcu::ConstPixelBufferAccess resultBuffer(m_format, gridSize.x(), gridSize.y(), gridSize.z(), outputBufferAllocation.getHostPtr());

	for (deInt32 z = 0; z < resultBuffer.getDepth();  z++)
	for (deInt32 y = 0; y < resultBuffer.getHeight(); y++)
	for (deInt32 x = 0; x < resultBuffer.getWidth();  x++)
	{
		deInt32 resultValue = resultBuffer.getPixelInt(x, y, z).x();

		if (isOrderIndependentAtomicOperation(m_operation))
		{
			deInt32 reference = getOperationInitialValue(m_operation);

			for (deInt32 i = 0; i < static_cast<deInt32>(NUM_INVOCATIONS_PER_PIXEL); i++)
			{
				const IVec3 gid(x + i*gridSize.x(), y, z);
				reference = computeBinaryAtomicOperationResult(m_operation, reference, getAtomicFuncArgument(m_operation, gid, extendedGridSize));
			}

			if (resultValue != reference)
				return false;
		}
		else if (m_operation == ATOMIC_OPERATION_EXCHANGE)
		{
			// Check if the end result equals one of the atomic args.
			bool matchFound = false;

			for (deInt32 i = 0; i < static_cast<deInt32>(NUM_INVOCATIONS_PER_PIXEL) && !matchFound; i++)
			{
				const IVec3 gid(x + i*gridSize.x(), y, z);
				matchFound = (resultValue == getAtomicFuncArgument(m_operation, gid, extendedGridSize));
			}

			if (!matchFound)
				return false;
		}
		else
			DE_ASSERT(false);
	}
	return true;
}